

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

Float pbrt::SampleSmoothStep(Float u,Float a,Float b)

{
  Float in_XMM0_Da;
  float fVar1;
  Float in_XMM1_Da;
  undefined4 in_XMM2_Da;
  float unaff_retaddr;
  float unaff_retaddr_00;
  anon_class_12_3_4e9287b8 in_stack_00000018;
  anon_class_12_3_4e9287b8 cdfMinusU;
  
  fVar1 = NewtonBisection<float,pbrt::SampleSmoothStep(float,float,float)::_lambda(float)_1_>
                    (unaff_retaddr_00,unaff_retaddr,in_stack_00000018,in_XMM0_Da,in_XMM1_Da,
                     (enable_if_t<std::is_floating_point<float>::value> *)
                     CONCAT44(in_XMM2_Da,in_XMM0_Da));
  return fVar1;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleSmoothStep(Float u, Float a, Float b) {
    DCHECK_LT(a, b);
    auto cdfMinusU = [=](Float x) -> std::pair<Float, Float> {
        Float t = (x - a) / (b - a);
        Float P = 2 * Pow<3>(t) - Pow<4>(t);
        Float PDeriv = SmoothStepPDF(x, a, b);
        return {P - u, PDeriv};
    };
    return NewtonBisection(a, b, cdfMinusU);
}